

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8Converter.cpp
# Opt level: O2

string * __thiscall
UtfConverter::toUtf8_abi_cxx11_
          (string *__return_storage_ptr__,UtfConverter *this,uint8_t *start,size_t numBytes,
          SourceFormat srcFormat)

{
  undefined4 *puVar1;
  code *pcVar2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *vec;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *vec_00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *vec_01;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *vec_02;
  undefined4 in_register_00000084;
  uint *local_1a8;
  undefined8 local_1a0;
  uint local_198;
  undefined4 uStack_194;
  undefined4 uStack_190;
  undefined4 uStack_18c;
  ostringstream ss;
  
  switch((int)numBytes) {
  case 1:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<unsigned_char_const*>
              ((string *)__return_storage_ptr__,this,start + (long)this);
    return __return_storage_ptr__;
  case 2:
    pcVar2 = anon_unknown.dwarf_2ead7e::read_le16;
    (anonymous_namespace)::make_vector<unsigned_short(*)(unsigned_char_const*)>
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&ss,
               (_anonymous_namespace_ *)this,start,0x1ebf5e,
               (_func_unsigned_short_uchar_ptr *)CONCAT44(in_register_00000084,srcFormat));
    (anonymous_namespace)::
    from_utf_nn<unsigned_short,convertUTF::ConversionResult(*)(unsigned_short_const**,unsigned_short_const*,unsigned_char**,unsigned_char_const*,convertUTF::ConversionFlags)>
              (__return_storage_ptr__,(_anonymous_namespace_ *)&ss,vec_02,pcVar2);
    break;
  case 3:
    pcVar2 = anon_unknown.dwarf_2ead7e::read_be16;
    (anonymous_namespace)::make_vector<unsigned_short(*)(unsigned_char_const*)>
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&ss,
               (_anonymous_namespace_ *)this,start,0x1ebf56,
               (_func_unsigned_short_uchar_ptr *)CONCAT44(in_register_00000084,srcFormat));
    (anonymous_namespace)::
    from_utf_nn<unsigned_short,convertUTF::ConversionResult(*)(unsigned_short_const**,unsigned_short_const*,unsigned_char**,unsigned_char_const*,convertUTF::ConversionFlags)>
              (__return_storage_ptr__,(_anonymous_namespace_ *)&ss,vec_00,pcVar2);
    break;
  case 4:
    pcVar2 = anon_unknown.dwarf_2ead7e::read_le32;
    (anonymous_namespace)::make_vector<unsigned_int(*)(unsigned_char_const*)>
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&ss,
               (_anonymous_namespace_ *)this,start,0x1ec232,
               (_func_uint_uchar_ptr *)CONCAT44(in_register_00000084,srcFormat));
    (anonymous_namespace)::
    from_utf_nn<unsigned_int,convertUTF::ConversionResult(*)(unsigned_int_const**,unsigned_int_const*,unsigned_char**,unsigned_char_const*,convertUTF::ConversionFlags)>
              (__return_storage_ptr__,(_anonymous_namespace_ *)&ss,vec_01,pcVar2);
    goto LAB_001ebb5c;
  case 5:
    pcVar2 = anon_unknown.dwarf_2ead7e::read_be32;
    (anonymous_namespace)::make_vector<unsigned_int(*)(unsigned_char_const*)>
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&ss,
               (_anonymous_namespace_ *)this,start,0x1ec22d,
               (_func_uint_uchar_ptr *)CONCAT44(in_register_00000084,srcFormat));
    (anonymous_namespace)::
    from_utf_nn<unsigned_int,convertUTF::ConversionResult(*)(unsigned_int_const**,unsigned_int_const*,unsigned_char**,unsigned_char_const*,convertUTF::ConversionFlags)>
              (__return_storage_ptr__,(_anonymous_namespace_ *)&ss,vec,pcVar2);
LAB_001ebb5c:
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&ss);
    return __return_storage_ptr__;
  default:
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
    std::operator<<((ostream *)&ss,"Unknown parameter to UtfConverter::toUtf8");
    puVar1 = (undefined4 *)__cxa_allocate_exception(0x28);
    std::__cxx11::stringbuf::str();
    *puVar1 = 3;
    *(undefined4 **)(puVar1 + 2) = puVar1 + 6;
    if (local_1a8 == &local_198) {
      puVar1[6] = local_198;
      puVar1[7] = uStack_194;
      puVar1[8] = uStack_190;
      puVar1[9] = uStack_18c;
    }
    else {
      *(uint **)(puVar1 + 2) = local_1a8;
      *(ulong *)(puVar1 + 6) = CONCAT44(uStack_194,local_198);
    }
    *(undefined8 *)(puVar1 + 4) = local_1a0;
    local_198 = local_198 & 0xffffff00;
    __cxa_throw(puVar1,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
  }
  std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
            ((_Vector_base<unsigned_short,_std::allocator<unsigned_short>_> *)&ss);
  return __return_storage_ptr__;
}

Assistant:

std::string toUtf8(const uint8_t *start, const size_t numBytes, const SourceFormat srcFormat)
{
    switch (srcFormat)
    {
    case SourceFormat::sfUTF8:
        return {start, start + numBytes};
    case SourceFormat::sfUTF16be:
        return from_utf_nn(make_vector(start, numBytes, read_be16), ConvertUTF16toUTF8);
    case SourceFormat::sfUTF16le:
        return from_utf_nn(make_vector(start, numBytes, read_le16), ConvertUTF16toUTF8);
    case SourceFormat::sfUTF32be:
        return from_utf_nn(make_vector(start, numBytes, read_be32), ConvertUTF32toUTF8);
    case SourceFormat::sfUTF32le:
        return from_utf_nn(make_vector(start, numBytes, read_le32), ConvertUTF32toUTF8);
#ifdef _WIN32
    case SourceFormat::sfANSI:
    {
        return ::toUtf8(fromAcp(reinterpret_cast<const char *>(start), static_cast<int>(numBytes)).data());
    }
#endif
    default:
        THROW(ERR_COMMON, "Unknown parameter to UtfConverter::toUtf8")
    }
}